

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateParser
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  string *args_1;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  args_1 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
             ,(char (*) [10])0x77c586,args_1);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "private static volatile com.google.protobuf.Parser<$classname$> "
      "PARSER;\n"
      "\n"
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return DEFAULT_INSTANCE.getParserForType();\n"
      "}\n",
      "classname", descriptor_->name());
}